

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O0

string * __thiscall
helics::EmptyCore::query_abi_cxx11_
          (EmptyCore *this,string_view target,string_view queryStr,HelicsSequencingModes param_4)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string *in_RDI;
  __sv_type _Var2;
  undefined1 in_stack_00000140 [16];
  string *psVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff88;
  JsonErrorCodes code;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  psVar3 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RSI,(char *)in_RDI);
  __x._M_str = (char *)in_stack_ffffffffffffff60;
  __x._M_len = in_stack_ffffffffffffff58;
  bVar1 = std::operator==(__x,in_stack_ffffffffffffff48);
  if (!bVar1) {
    (**(code **)(in_RSI->_M_len + 0x60))();
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    code = _Var2._M_len._4_4_;
    __x_00._M_str = (char *)in_stack_ffffffffffffff60;
    __x_00._M_len = in_stack_ffffffffffffff58;
    bVar1 = std::operator==(__x_00,in_stack_ffffffffffffff48);
    if ((!bVar1) &&
       (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), !bVar1
       )) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      generateJsonErrorResponse(code,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
      return psVar3;
    }
  }
  quickCoreQueries_abi_cxx11_((string_view)in_stack_00000140);
  return psVar3;
}

Assistant:

std::string EmptyCore::query(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes /*mode*/)
{
    if (target == "core" || target == getIdentifier() || target.empty()) {
        return quickCoreQueries(queryStr);
    }
    return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Federate is disconnected");
}